

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O3

void opengv::absolute_pose::modules::gpnp5::sPolynomial18
               (Matrix<double,_44,_80,_0,_44,_80> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  
  dVar1 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
          m_storage.m_data.array[0xa29];
  dVar2 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
          m_storage.m_data.array[0xa56];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x48a] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xa55] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xa82] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x4b6] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xa81] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x4e2] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xaae] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x50e] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xaad] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xada] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x53a] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xad9] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x566] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xb06] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x592] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb05] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x5ea] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xb32] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x616] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb31] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb5e] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x642] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb5d] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x66e] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xb8a] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x69a] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb89] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x6f2] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xbb6] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x71e] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xbb5] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x7a2] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xbe2] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x7ce] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xbe1] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc0e] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x7fa] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc0d] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x826] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xc3a] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x852] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc39] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x8aa] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xc66] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x8d6] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc65] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x95a] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xc92] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x986] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc91] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xa36] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xcbe] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xa62] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xcbd] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xcea] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xa8e] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xce9] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xaba] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xd16] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xae6] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd15] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xb3e] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xd42] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xb6a] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd41] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xbee] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xd6e] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xc1a] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd6d] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xcca] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage
        .m_data.array[0xd9a] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xcf6] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd99] / dVar1;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp5::sPolynomial18( Eigen::Matrix<double,44,80> & groebnerMatrix )
{
  groebnerMatrix(18,26) = (groebnerMatrix(5,60)/(groebnerMatrix(5,59))-groebnerMatrix(6,61)/(groebnerMatrix(6,60)));
  groebnerMatrix(18,27) = groebnerMatrix(5,61)/(groebnerMatrix(5,59));
  groebnerMatrix(18,28) = -groebnerMatrix(6,62)/(groebnerMatrix(6,60));
  groebnerMatrix(18,29) = (groebnerMatrix(5,62)/(groebnerMatrix(5,59))-groebnerMatrix(6,63)/(groebnerMatrix(6,60)));
  groebnerMatrix(18,30) = groebnerMatrix(5,63)/(groebnerMatrix(5,59));
  groebnerMatrix(18,31) = -groebnerMatrix(6,64)/(groebnerMatrix(6,60));
  groebnerMatrix(18,32) = groebnerMatrix(5,64)/(groebnerMatrix(5,59));
  groebnerMatrix(18,34) = -groebnerMatrix(6,65)/(groebnerMatrix(6,60));
  groebnerMatrix(18,35) = (groebnerMatrix(5,65)/(groebnerMatrix(5,59))-groebnerMatrix(6,66)/(groebnerMatrix(6,60)));
  groebnerMatrix(18,36) = groebnerMatrix(5,66)/(groebnerMatrix(5,59));
  groebnerMatrix(18,37) = -groebnerMatrix(6,67)/(groebnerMatrix(6,60));
  groebnerMatrix(18,38) = groebnerMatrix(5,67)/(groebnerMatrix(5,59));
  groebnerMatrix(18,40) = -groebnerMatrix(6,68)/(groebnerMatrix(6,60));
  groebnerMatrix(18,41) = groebnerMatrix(5,68)/(groebnerMatrix(5,59));
  groebnerMatrix(18,44) = -groebnerMatrix(6,69)/(groebnerMatrix(6,60));
  groebnerMatrix(18,45) = (groebnerMatrix(5,69)/(groebnerMatrix(5,59))-groebnerMatrix(6,70)/(groebnerMatrix(6,60)));
  groebnerMatrix(18,46) = groebnerMatrix(5,70)/(groebnerMatrix(5,59));
  groebnerMatrix(18,47) = -groebnerMatrix(6,71)/(groebnerMatrix(6,60));
  groebnerMatrix(18,48) = groebnerMatrix(5,71)/(groebnerMatrix(5,59));
  groebnerMatrix(18,50) = -groebnerMatrix(6,72)/(groebnerMatrix(6,60));
  groebnerMatrix(18,51) = groebnerMatrix(5,72)/(groebnerMatrix(5,59));
  groebnerMatrix(18,54) = -groebnerMatrix(6,73)/(groebnerMatrix(6,60));
  groebnerMatrix(18,55) = groebnerMatrix(5,73)/(groebnerMatrix(5,59));
  groebnerMatrix(18,59) = -groebnerMatrix(6,74)/(groebnerMatrix(6,60));
  groebnerMatrix(18,60) = (groebnerMatrix(5,74)/(groebnerMatrix(5,59))-groebnerMatrix(6,75)/(groebnerMatrix(6,60)));
  groebnerMatrix(18,61) = groebnerMatrix(5,75)/(groebnerMatrix(5,59));
  groebnerMatrix(18,62) = -groebnerMatrix(6,76)/(groebnerMatrix(6,60));
  groebnerMatrix(18,63) = groebnerMatrix(5,76)/(groebnerMatrix(5,59));
  groebnerMatrix(18,65) = -groebnerMatrix(6,77)/(groebnerMatrix(6,60));
  groebnerMatrix(18,66) = groebnerMatrix(5,77)/(groebnerMatrix(5,59));
  groebnerMatrix(18,69) = -groebnerMatrix(6,78)/(groebnerMatrix(6,60));
  groebnerMatrix(18,70) = groebnerMatrix(5,78)/(groebnerMatrix(5,59));
  groebnerMatrix(18,74) = -groebnerMatrix(6,79)/(groebnerMatrix(6,60));
  groebnerMatrix(18,75) = groebnerMatrix(5,79)/(groebnerMatrix(5,59));
}